

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::shiftBack(HEkkDual *this,HighsInt iCol)

{
  double dVar1;
  long lVar2;
  reference pvVar3;
  int in_ESI;
  long in_RDI;
  HighsSimplexInfo *info;
  
  lVar2 = *(long *)(in_RDI + 0x10);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(lVar2 + 0x2590),(long)in_ESI);
  if ((*pvVar3 != 0.0) || (NAN(*pvVar3))) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(lVar2 + 0x2590),(long)in_ESI);
    dVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(lVar2 + 0x2578),(long)in_ESI);
    *pvVar3 = *pvVar3 - dVar1;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(lVar2 + 0x2590),(long)in_ESI);
    *pvVar3 = 0.0;
    *(int *)(*(long *)(in_RDI + 0x40) + 0x8b0) = *(int *)(*(long *)(in_RDI + 0x40) + 0x8b0) + -1;
  }
  return;
}

Assistant:

void HEkkDual::shiftBack(const HighsInt iCol) {
  HighsSimplexInfo& info = ekk_instance_.info_;
  if (!info.workShift_[iCol]) return;
  info.workDual_[iCol] -= info.workShift_[iCol];
  info.workShift_[iCol] = 0;
  // Analysis
  analysis->net_num_single_cost_shift--;
}